

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  gost_grasshopper_cipher_ctx *c;
  mgm128_context *ctx_00;
  
  c = (gost_grasshopper_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  if (key == (uchar *)0x0 && iv == (uchar *)0x0) {
    return 1;
  }
  if (key == (uchar *)0x0) {
    if (c[10].encrypt_round_keys.k[5].d[0] == 0) {
      memcpy((void *)c[10].decrypt_round_keys.k[8].q[0],iv,
             (long)*(int *)((long)c[10].decrypt_round_keys.k + 0x88));
    }
    else {
      iVar1 = gost_mgm128_setiv((mgm128_context *)((long)c[10].encrypt_round_keys.k + 0x58),iv,
                                (long)*(int *)((long)c[10].decrypt_round_keys.k + 0x88));
      if (iVar1 != 1) {
        return 0;
      }
    }
    *(undefined4 *)((long)c[10].encrypt_round_keys.k + 0x54) = 1;
  }
  else {
    iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
    gost_grasshopper_cipher_key(c,key);
    ctx_00 = (mgm128_context *)((long)c[10].encrypt_round_keys.k + 0x58);
    gost_mgm128_init(ctx_00,c,gost_grasshopper_encrypt_wrap,gf128_mul_uint64,iVar1);
    if ((iv != (uchar *)0x0) ||
       ((*(int *)((long)c[10].encrypt_round_keys.k + 0x54) != 0 &&
        (iv = (uchar *)c[10].decrypt_round_keys.k[8].q[0], iv != (uchar *)0x0)))) {
      iVar1 = gost_mgm128_setiv(ctx_00,iv,(long)*(int *)((long)c[10].decrypt_round_keys.k + 0x88));
      if (iVar1 != 1) {
        return 0;
      }
      *(undefined4 *)((long)c[10].encrypt_round_keys.k + 0x54) = 1;
    }
    c[10].encrypt_round_keys.k[5].d[0] = 1;
  }
  return 1;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_mgm(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                                 const unsigned char *iv, int enc)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int bl;

    if (!iv && !key)
        return 1;
    if (key) {
        bl = EVP_CIPHER_CTX_iv_length(ctx);
        gost_grasshopper_cipher_key(&mctx->ks.gh_ks, key);
        gost_mgm128_init(&mctx->mgm, &mctx->ks,
                         (block128_f) gost_grasshopper_encrypt_wrap, gf128_mul_uint64, bl);

        /*
         * If we have an iv can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && mctx->iv_set)
            iv = mctx->iv;
        if (iv) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
            mctx->iv_set = 1;
        }
        mctx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (mctx->key_set) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
        }
        else
            memcpy(mctx->iv, iv, mctx->ivlen);
        mctx->iv_set = 1;
    }
    return 1;
}